

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::util_reportModelMPS(HModel *this,char *filename)

{
  int iVar1;
  bool bVar2;
  _Setprecision _Var3;
  ostream *poVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  char *in_RSI;
  long in_RDI;
  bool bVar8;
  int i_3;
  int i_2;
  int i_1;
  bool ll;
  int k;
  int j;
  char buff [55];
  int i;
  ofstream output;
  int local_284;
  int local_280;
  int local_27c;
  int local_270;
  int local_26c;
  char local_268 [68];
  int local_224;
  int local_220;
  ostream local_210 [528];
  
  std::ofstream::ofstream(local_210,in_RSI,_S_out);
  poVar4 = std::operator<<(local_210,"NAME");
  poVar4 = std::operator<<(poVar4,"\t");
  poVar4 = std::operator<<(poVar4,(string *)(in_RDI + 0x628));
  poVar4 = std::operator<<(poVar4," SIZE: N=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(in_RDI + 0x60c));
  poVar4 = std::operator<<(poVar4,",  M=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(in_RDI + 0x610));
  poVar4 = std::operator<<(poVar4,", NZ=");
  sVar5 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660));
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::operator<<(poVar4,'\n');
  std::operator<<(local_210,"ROWS\n");
  for (local_220 = 1; local_220 <= *(int *)(in_RDI + 0x610); local_220 = local_220 + 1) {
    poVar4 = std::operator<<(local_210," E  R");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_220);
    std::operator<<(poVar4,"\n");
  }
  poVar4 = std::operator<<(local_210," N  COST");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<(local_210,"COLUMNS\n");
  local_224 = (int)std::setprecision(10);
  std::operator<<(local_210,(_Setprecision)local_224);
  local_26c = 0;
  local_270 = 0;
  bVar8 = true;
  bVar2 = true;
  while (pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                             (long)*(int *)(in_RDI + 0x60c)), local_26c < *pvVar6) {
    for (; pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                               (long)(local_270 + 1)), local_26c < *pvVar6;
        local_26c = local_26c + 1) {
      bVar8 = bVar8 == false;
      if (bVar8) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_26c);
        iVar1 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                            (long)local_26c);
        sprintf(local_268,"        R%-3d %12f",*pvVar7,(ulong)(iVar1 + 1));
        poVar4 = std::operator<<(local_210,local_268);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),(long)local_26c);
        iVar1 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),
                            (long)local_26c);
        sprintf(local_268,"    C%-3d      R%-3d %12f",*pvVar7,(ulong)(local_270 + 1),
                (ulong)(iVar1 + 1));
        std::operator<<(local_210,local_268);
      }
      bVar2 = bVar8;
    }
    if (!bVar2) {
      std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
      bVar8 = true;
      bVar2 = true;
    }
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),(long)local_270)
    ;
    if (0.0 < ABS(*pvVar7)) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),
                          (long)local_270);
      sprintf(local_268,"    C%-3d      COST %12f",*pvVar7,(ulong)(local_270 + 1));
      poVar4 = std::operator<<(local_210,local_268);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    local_270 = local_270 + 1;
  }
  _Var3 = std::setprecision(10);
  std::operator<<(local_210,_Var3);
  std::operator<<(local_210,"RHS\n");
  bVar8 = true;
  for (local_27c = 0; local_27c < *(int *)(in_RDI + 0x610); local_27c = local_27c + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),(long)local_27c)
    ;
    if (0.0 < ABS(*pvVar7)) {
      bVar8 = !bVar8;
      if (bVar8) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                            (long)local_27c);
        sprintf(local_268,"        R%-3d %12g",*pvVar7,(ulong)(local_27c + 1));
        poVar4 = std::operator<<(local_210,local_268);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),
                            (long)local_27c);
        sprintf(local_268,"    DEMANDS   R%-3d %12g",*pvVar7,(ulong)(local_27c + 1));
        std::operator<<(local_210,local_268);
      }
    }
  }
  if (!bVar8) {
    std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<(local_210,"BOUNDS\n");
  for (local_280 = 0; local_280 < *(int *)(in_RDI + 0x60c); local_280 = local_280 + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),(long)local_280)
    ;
    if (*pvVar7 <= 1e+200 && *pvVar7 != 1e+200) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),
                          (long)local_280);
      sprintf(local_268,"  UP BND     C%-3d %12g\n",*pvVar7,(ulong)(local_280 + 1));
      std::operator<<(local_210,local_268);
    }
  }
  for (local_284 = 0; local_284 < *(int *)(in_RDI + 0x60c); local_284 = local_284 + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),(long)local_284)
    ;
    if (0.0 < ABS(*pvVar7)) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),
                          (long)local_284);
      sprintf(local_268,"  LO BND     C%-3d %12g\n",*pvVar7,(ulong)(local_284 + 1));
      std::operator<<(local_210,local_268);
    }
  }
  std::operator<<(local_210,"ENDATA");
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void HModel::util_reportModelMPS(const char *filename) {
  ofstream output(filename);
  //COLUMNS are numCol + #constr with upper bound + #constr with lower bound: numColU and numColL
  output<<"NAME"<<"\t"<<modelName<<" SIZE: N="<<numCol<<",  M="<<numRow<<", NZ="<<Aindex.size()<<'\n';	

  output << "ROWS\n";
  for (int i = 1; i <= numRow; i++) {
    output << " E  R"<< i << "\n";
  }
  output << " N  COST"<<endl;
  output <<"COLUMNS\n";
  output << setprecision(10);
  
  char buff [55];
  
  int j=0; //element index
  int k=0; //column index
  bool ll=true;
  while (j<Astart[numCol]) {
    while (j<Astart[k+1]) {
      if (ll) {
	sprintf(buff, "    C%-3d      R%-3d %12f", k+1,  Aindex[j]+1, Avalue[j]);
	output<<buff;
	ll = false;
	j++;
      }
      else {
	sprintf(buff, "        R%-3d %12f", Aindex[j]+1, Avalue[j]);
	output<<buff<<endl;
	ll=true;
	j++;					
      }
    }
    if (!ll) {
      output<<endl;
      ll = true;
    }
    if (fabs(colCost[k])>0) {
      sprintf(buff, "    C%-3d      COST %12f", k+1,  colCost[k]);
      output<<buff<<endl;
    }
    k++;
  }
  
  output << setprecision(10);
  output <<"RHS\n"; //RHS for all cases
  ll = true;
  for (int i=0;i<numRow;i++) 
    if (fabs(rowUpper[i])>0) {
      if (ll) {
	sprintf(buff,"    DEMANDS   R%-3d %12g", i+1, rowUpper[i]);
	output<<buff;
	ll = false;
      }
      else {
	sprintf(buff,"        R%-3d %12g", i+1, rowUpper[i]);
	output<<buff<<endl;
	ll=true;					
      }
    }
  
  
  if (!ll)
    output<<endl;
  //omega and gamma by default have lb 0 and ub infinity, edit in future if needed
  output <<"BOUNDS\n";
  for (int i=0;i<numCol;i++) 
    if (colUpper[i]<HSOL_CONST_INF)  {
      sprintf(buff,"  UP BND     C%-3d %12g\n", i+1, colUpper[i]);
      output<<buff;
    }
  
  
  for (int i=0;i<numCol;i++) 
    if (fabs(colLower[i])>0) {
      sprintf(buff,"  LO BND     C%-3d %12g\n", i+1, colLower[i]);
      output<<buff;
    }
  
  output <<"ENDATA";
  
  output.close();
}